

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O2

faidx_t * fai_build_core(BGZF *bgzf)

{
  char cVar1;
  uint uVar2;
  faidx_t *idx;
  kh_s_t *pkVar3;
  ushort **ppuVar4;
  char *name;
  long lVar5;
  ulong uVar6;
  char *__format;
  char cVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  uint local_60;
  uint local_5c;
  uint64_t local_48;
  
  idx = (faidx_t *)calloc(1,0x20);
  pkVar3 = kh_init_s();
  idx->hash = pkVar3;
  lVar5 = -1;
  iVar8 = 0;
  name = (char *)0x0;
  cVar7 = '\0';
  local_48 = 0;
  local_60 = 0xffffffff;
  local_5c = 0xffffffff;
LAB_0013482f:
  do {
    do {
      uVar2 = bgzf_getc(bgzf);
      if ((int)uVar2 < 0) {
        if (name == (char *)0x0) {
          free(idx);
          return (faidx_t *)0x0;
        }
        fai_insert_index(idx,name,(int)lVar5,local_5c,local_60,local_48);
        free(name);
        return idx;
      }
      if (uVar2 != 10) {
        if (uVar2 == 0x3e) {
          if (-1 < lVar5) {
            fai_insert_index(idx,name,(int)lVar5,local_5c,local_60,local_48);
          }
          uVar6 = 0;
          goto LAB_00134957;
        }
        break;
      }
      if (cVar7 == '\x01') {
        local_48 = bgzf_utell(bgzf);
        cVar7 = '\x01';
        goto LAB_0013482f;
      }
    } while (cVar7 == '\x02' || cVar7 == '\0' && lVar5 < 0);
    if (cVar7 == '\x03') {
      __format = "[fai_build_core] inlined empty line is not allowed in sequence \'%s\'.\n";
      goto LAB_00134abd;
    }
    uVar9 = 0;
    ppuVar4 = __ctype_b_loc();
    uVar10 = 1;
    do {
      uVar9 = ((*ppuVar4)[uVar2] >> 0xf) + uVar9;
      uVar2 = bgzf_getc(bgzf);
      uVar10 = uVar10 + 1;
      if ((int)uVar2 < 0) break;
    } while (uVar2 != 10);
    cVar1 = cVar7;
    if (cVar7 == '\x02') {
      cVar1 = '\x03';
    }
    if ((cVar1 == '\x03') && (uVar9 != 0)) {
      __format = "[fai_build_core] different line length in sequence \'%s\'.\n";
LAB_00134abd:
      fprintf(_stderr,__format,name);
LAB_00134a88:
      free(name);
      fai_destroy(idx);
      return (faidx_t *)0x0;
    }
    lVar5 = lVar5 + (ulong)uVar9;
    if (cVar7 == '\0') {
      cVar7 = (uVar9 != local_60 || uVar10 != local_5c) * '\x02';
    }
    else {
      bVar11 = cVar7 == '\x01';
      cVar7 = cVar1;
      if (bVar11) {
        cVar7 = '\0';
        local_60 = uVar9;
        local_5c = uVar10;
      }
    }
  } while( true );
LAB_00134957:
  uVar2 = bgzf_getc(bgzf);
  if ((int)uVar2 < 0) {
    name[uVar6 & 0xffffffff] = '\0';
    fwrite("[fai_build_core] the last entry has no sequence\n",0x30,1,_stderr);
    goto LAB_00134a88;
  }
  ppuVar4 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar4 + (ulong)uVar2 * 2 + 1) & 0x20) != 0) goto LAB_001349c7;
  if (iVar8 < (int)uVar6 + 2) {
    uVar10 = (int)uVar6 + 1;
    uVar10 = uVar10 >> 1 | uVar10;
    uVar10 = uVar10 >> 2 | uVar10;
    uVar10 = uVar10 >> 4 | uVar10;
    uVar10 = uVar10 >> 8 | uVar10;
    iVar8 = (uVar10 >> 0x10 | uVar10) + 1;
    name = (char *)realloc(name,(long)iVar8);
  }
  name[uVar6] = (char)uVar2;
  uVar6 = uVar6 + 1;
  goto LAB_00134957;
LAB_001349c7:
  name[uVar6 & 0xffffffff] = '\0';
  do {
    if (uVar2 == 10) break;
    uVar2 = bgzf_getc(bgzf);
  } while (-1 < (int)uVar2);
  local_48 = bgzf_utell(bgzf);
  cVar7 = '\x01';
  lVar5 = 0;
  goto LAB_0013482f;
}

Assistant:

faidx_t *fai_build_core(BGZF *bgzf)
{
    char *name;
    int c;
    int l_name, m_name;
    int line_len, line_blen, state;
    int l1, l2;
    faidx_t *idx;
    uint64_t offset;
    int64_t len;

    idx = (faidx_t*)calloc(1, sizeof(faidx_t));
    idx->hash = kh_init(s);
    name = 0; l_name = m_name = 0;
    len = line_len = line_blen = -1; state = 0; l1 = l2 = -1; offset = 0;
    while ( (c=bgzf_getc(bgzf))>=0 ) {
        if (c == '\n') { // an empty line
            if (state == 1) {
                offset = bgzf_utell(bgzf);
                continue;
            } else if ((state == 0 && len < 0) || state == 2) continue;
        }
        if (c == '>') { // fasta header
            if (len >= 0)
                fai_insert_index(idx, name, len, line_len, line_blen, offset);
            l_name = 0;
            while ( (c=bgzf_getc(bgzf))>=0 && !isspace(c)) {
                if (m_name < l_name + 2) {
                    m_name = l_name + 2;
                    kroundup32(m_name);
                    name = (char*)realloc(name, m_name);
                }
                name[l_name++] = c;
            }
            name[l_name] = '\0';
            if ( c<0 ) {
                fprintf(stderr, "[fai_build_core] the last entry has no sequence\n");
                free(name); fai_destroy(idx);
                return 0;
            }
            if (c != '\n') while ( (c=bgzf_getc(bgzf))>=0 && c != '\n');
            state = 1; len = 0;
            offset = bgzf_utell(bgzf);
        } else {
            if (state == 3) {
                fprintf(stderr, "[fai_build_core] inlined empty line is not allowed in sequence '%s'.\n", name);
                free(name); fai_destroy(idx);
                return 0;
            }
            if (state == 2) state = 3;
            l1 = l2 = 0;
            do {
                ++l1;
                if (isgraph(c)) ++l2;
            } while ( (c=bgzf_getc(bgzf))>=0 && c != '\n');
            if (state == 3 && l2) {
                fprintf(stderr, "[fai_build_core] different line length in sequence '%s'.\n", name);
                free(name); fai_destroy(idx);
                return 0;
            }
            ++l1; len += l2;
            if (state == 1) line_len = l1, line_blen = l2, state = 0;
            else if (state == 0) {
                if (l1 != line_len || l2 != line_blen) state = 2;
            }
        }
    }
    if ( name )
        fai_insert_index(idx, name, len, line_len, line_blen, offset);
    else
    {
        free(idx);
        return NULL;
    }
    free(name);
    return idx;
}